

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
slang::SmallVectorBase<slang::Diagnostic>::append<std::move_iterator<slang::Diagnostic*>,void>
          (SmallVectorBase<slang::Diagnostic> *this,move_iterator<slang::Diagnostic_*> first,
          move_iterator<slang::Diagnostic_*> last)

{
  size_type newCapacity;
  
  newCapacity = ((long)last._M_current - (long)first._M_current) / 0x70 + this->len;
  reserve(this,newCapacity);
  std::__uninitialized_copy<false>::
  __uninit_copy<std::move_iterator<slang::Diagnostic*>,slang::Diagnostic*>
            (first,last,this->data_ + this->len);
  this->len = newCapacity;
  return;
}

Assistant:

void append(TIter first, TIter last) {
        auto numElems = static_cast<size_type>(std::distance(first, last));
        auto newSize = len + numElems;
        reserve(newSize);

        std::uninitialized_copy(first, last, end());
        len = newSize;
    }